

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_30c12::DFDVkFormatListTest_ReconstructDFDBytesPlanes_Test::TestBody
          (DFDVkFormatListTest_ReconstructDFDBytesPlanes_Test *this)

{
  bool bVar1;
  ulong uVar2;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  uint16_t bitOffset;
  uint16_t channelId;
  uint32_t sample;
  uint32_t dfdSize;
  uint32_t bdbSize;
  uint32_t sampleCount;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  uint32_t i;
  uint32_t origBytesPlane47;
  uint32_t origBytesPlane03;
  uint32_t *bdb;
  uint32_t *dfd;
  char (*in_stack_fffffffffffffdc8) [34];
  AssertionResult *in_stack_fffffffffffffdd0;
  uint *in_stack_fffffffffffffdd8;
  char *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffdf8;
  AssertHelper *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  char *in_stack_fffffffffffffe40;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffe48;
  AssertHelper *in_stack_fffffffffffffe50;
  AssertionResult local_198 [2];
  uint local_178;
  undefined4 local_174;
  AssertionResult local_170 [2];
  uint local_150;
  undefined4 local_14c;
  AssertionResult local_148 [2];
  uint local_128;
  undefined4 local_124;
  AssertionResult local_120 [2];
  uint local_100;
  undefined4 local_fc;
  AssertionResult local_f8;
  ushort local_e4;
  ushort local_e2;
  uint local_e0;
  uint local_dc;
  int local_d8;
  uint local_d4;
  AssertionResult local_c0 [2];
  AssertionResult local_a0;
  uint local_8c;
  string local_88 [40];
  undefined8 local_60;
  undefined1 local_39;
  AssertionResult local_38;
  uint local_24;
  undefined4 local_20;
  undefined4 local_1c;
  uint *local_18;
  void *local_10;
  
  local_24 = 0;
  while( true ) {
    if (0xfe < local_24) {
      for (local_d4 = 1; local_d4 < 3; local_d4 = local_d4 + 1) {
        local_d8 = (local_d4 * 4 + 6) * 4;
        local_dc = local_d8 + 4;
        uVar2 = SUB168(ZEXT416(local_dc) * ZEXT816(4),0);
        if (SUB168(ZEXT416(local_dc) * ZEXT816(4),8) != 0) {
          uVar2 = 0xffffffffffffffff;
        }
        local_10 = operator_new__(uVar2);
        local_18 = (uint *)((long)local_10 + 4);
        *local_18 = *local_18 & 0xfffe0000;
        *local_18 = *local_18 & 0x1ffff;
        *(uint *)((long)local_10 + 8) = *(uint *)((long)local_10 + 8) & 0xffff0000 | 2;
        *(uint *)((long)local_10 + 8) = *(uint *)((long)local_10 + 8) & 0xffff | local_d8 << 0x10;
        *(uint *)((long)local_10 + 0xc) = *(uint *)((long)local_10 + 0xc) & 0xffffff00 | 0xa3;
        *(uint *)((long)local_10 + 0xc) = *(uint *)((long)local_10 + 0xc) & 0xffff00ff | 0x100;
        *(uint *)((long)local_10 + 0xc) = *(uint *)((long)local_10 + 0xc) & 0xff00ffff | 0x20000;
        *(uint *)((long)local_10 + 0xc) = *(uint *)((long)local_10 + 0xc) & 0xffffff;
        *(undefined4 *)((long)local_10 + 0x10) = 0x303;
        *(undefined4 *)((long)local_10 + 0x14) = 0;
        *(undefined4 *)((long)local_10 + 0x18) = 0;
        for (local_e0 = 0; local_e0 < local_d4; local_e0 = local_e0 + 1) {
          if (local_e0 == 0) {
            local_e4 = 0;
            local_e2 = 0;
          }
          else {
            local_e4 = 0x40;
            local_e2 = 0xf;
          }
          local_18[local_e0 * 4 + 6] =
               local_18[local_e0 * 4 + 6] & 0xf0ffffff | (uint)local_e2 << 0x18;
          local_18[local_e0 * 4 + 6] = local_18[local_e0 * 4 + 6] & 0xfffffff;
          local_18[local_e0 * 4 + 7] = 0;
          local_18[local_e0 * 4 + 6] = local_18[local_e0 * 4 + 6] & 0xffff0000 | (uint)local_e4;
          local_18[local_e0 * 4 + 6] = local_18[local_e0 * 4 + 6] & 0xff00ffff | 0x3f0000;
          local_18[local_e0 * 4 + 8] = 0;
          local_18[local_e0 * 4 + 9] = 0xffffffff;
        }
        reconstructDFDBytesPlanesFromSamples(local_10);
        local_fc = 8;
        local_100 = local_18[4] & 0xff;
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                  (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                   (uint *)in_stack_fffffffffffffdd0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f8);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe00);
          in_stack_fffffffffffffdf8 =
               testing::AssertionResult::failure_message((AssertionResult *)0x14bdcf);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffe00,(Type)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                     in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                     in_stack_fffffffffffffde0);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffe50,(Message *)in_stack_fffffffffffffe48._M_head_impl);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdd0);
          testing::Message::~Message((Message *)0x14be2c);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x14be9d);
        if (local_d4 == 2) {
          local_124 = 8;
          local_128 = local_18[4] >> 8 & 0xff;
          testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                    (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                     (uint *)in_stack_fffffffffffffdd0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_120);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffe00);
            in_stack_fffffffffffffdf0 =
                 testing::AssertionResult::failure_message((AssertionResult *)0x14bf41);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffe00,(Type)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                       in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                       in_stack_fffffffffffffde0);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffe50,(Message *)in_stack_fffffffffffffe48._M_head_impl);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffdd0);
            testing::Message::~Message((Message *)0x14bf9e);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x14c009);
        }
        else {
          local_14c = 0;
          local_150 = local_18[4] >> 8 & 0xff;
          testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                    (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                     (uint *)in_stack_fffffffffffffdd0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_148);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffe00);
            in_stack_fffffffffffffde8 =
                 testing::AssertionResult::failure_message((AssertionResult *)0x14c0a4);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffe00,(Type)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                       in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                       in_stack_fffffffffffffde0);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffe50,(Message *)in_stack_fffffffffffffe48._M_head_impl);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffdd0);
            testing::Message::~Message((Message *)0x14c101);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x14c16c);
        }
        local_174 = 0;
        local_178 = local_18[4] >> 0x10 & 0xff;
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                  (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                   (uint *)in_stack_fffffffffffffdd0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_170);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe00);
          in_stack_fffffffffffffde0 =
               testing::AssertionResult::failure_message((AssertionResult *)0x14c204);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffe00,(Type)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                     in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                     in_stack_fffffffffffffde0);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffe50,(Message *)in_stack_fffffffffffffe48._M_head_impl);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdd0);
          testing::Message::~Message((Message *)0x14c261);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x14c2cf);
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                  (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                   (uint *)in_stack_fffffffffffffdd0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_198);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe00);
          in_stack_fffffffffffffdd8 =
               (uint *)testing::AssertionResult::failure_message((AssertionResult *)0x14c365);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffe00,(Type)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                     in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                     in_stack_fffffffffffffde0);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffe50,(Message *)in_stack_fffffffffffffe48._M_head_impl);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdd0);
          testing::Message::~Message((Message *)0x14c3c2);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x14c430);
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                  (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                   (uint *)in_stack_fffffffffffffdd0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool
                          ((AssertionResult *)&stack0xfffffffffffffe40);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe00);
          in_stack_fffffffffffffdd0 =
               (AssertionResult *)
               testing::AssertionResult::failure_message((AssertionResult *)0x14c49e);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffe00,(Type)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                     in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                     in_stack_fffffffffffffde0);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffe50,(Message *)in_stack_fffffffffffffe48._M_head_impl);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdd0);
          testing::Message::~Message((Message *)0x14c4ec);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x14c54e);
        if (local_10 != (void *)0x0) {
          operator_delete__(local_10);
        }
      }
      return;
    }
    local_10 = (void *)vk2dfd(DFDVkFormatListTest::formats[local_24]);
    local_39 = local_10 != (void *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffffdd0,(bool *)in_stack_fffffffffffffdc8,(type *)0x14b42b);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_38);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe00);
      testing::Message::operator<<((Message *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      local_60 = vkFormatString(DFDVkFormatListTest::formats[local_24]);
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffdd0,(char **)in_stack_fffffffffffffdc8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)in_stack_fffffffffffffe48._M_head_impl,in_stack_fffffffffffffe40
                 ,(char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                 in_stack_fffffffffffffe30);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe00,(Type)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                 in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                 in_stack_fffffffffffffde0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe50,(Message *)in_stack_fffffffffffffe48._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdd0);
      std::__cxx11::string::~string(local_88);
      testing::Message::~Message((Message *)0x14b549);
    }
    local_8c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x14b5f6);
    if (local_8c != 0) break;
    local_18 = (uint *)((long)local_10 + 4);
    local_1c = *(undefined4 *)((long)local_10 + 0x14);
    local_20 = *(undefined4 *)((long)local_10 + 0x18);
    *(undefined4 *)((long)local_10 + 0x14) = 0;
    *(undefined4 *)((long)local_10 + 0x14) = 0;
    reconstructDFDBytesPlanesFromSamples(local_10);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               (uint *)in_stack_fffffffffffffdd0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe00);
      testing::AssertionResult::failure_message((AssertionResult *)0x14b6e0);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe00,(Type)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                 in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                 in_stack_fffffffffffffde0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe50,(Message *)in_stack_fffffffffffffe48._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdd0);
      testing::Message::~Message((Message *)0x14b73d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x14b7ab);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               (uint *)in_stack_fffffffffffffdd0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe00);
      in_stack_fffffffffffffe00 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x14b820);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe00,(Type)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                 in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                 in_stack_fffffffffffffde0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe50,(Message *)in_stack_fffffffffffffe48._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdd0);
      testing::Message::~Message((Message *)0x14b87d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x14b8e8);
    free(local_10);
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

TEST_F(DFDVkFormatListTest, ReconstructDFDBytesPlanes) {

    uint32_t* dfd;
    uint32_t* bdb;
    uint32_t origBytesPlane03, origBytesPlane47;

    for (uint32_t i = 0; i < sizeof(formats) / sizeof(VkFormat); i++) {
        dfd = vk2dfd(formats[i]);
        ASSERT_TRUE(dfd != NULL) << "vk2dfd failed to produce DFD for "
                                 << vkFormatString(formats[i]);
        bdb = dfd + 1;
        // There are 4 bytesPlane values in one word. Capture all at once.
        origBytesPlane03 = bdb[KHR_DF_WORD_BYTESPLANE0];
        origBytesPlane47 = bdb[KHR_DF_WORD_BYTESPLANE4];
        bdb[KHR_DF_WORD_BYTESPLANE0] = 0U;
        bdb[KHR_DF_WORD_BYTESPLANE1] = 0U;
        reconstructDFDBytesPlanesFromSamples(dfd);
        EXPECT_EQ(origBytesPlane03, bdb[KHR_DF_WORD_BYTESPLANE0]);
        EXPECT_EQ(origBytesPlane47, bdb[KHR_DF_WORD_BYTESPLANE4]);
        free(dfd);
    }

    // No need to test reconstruction for UASTC as, colorModel aside, the DFD
    // is identical to that for VK_FORMAT_ASTC_4x4_BLOCK_UNORM which has been
    // tested above.

    // Make ETC1S DFDs and test reconstruction.
    for (uint32_t sampleCount = 1; sampleCount < 3; sampleCount++) {
        uint32_t bdbSize = KHR_DF_WORD_SAMPLESTART
                           + sampleCount * KHR_DF_WORD_SAMPLEWORDS;
        bdbSize *= sizeof(uint32_t);
        uint32_t dfdSize = bdbSize + 1 * sizeof(uint32_t);
        dfd = new uint32_t[dfdSize];
        bdb = dfd + 1;

        KHR_DFDSETVAL(bdb, VENDORID, KHR_DF_VENDORID_KHRONOS);
        KHR_DFDSETVAL(bdb, DESCRIPTORTYPE, KHR_DF_KHR_DESCRIPTORTYPE_BASICFORMAT);
        KHR_DFDSETVAL(bdb, VERSIONNUMBER, KHR_DF_VERSIONNUMBER_LATEST);
        KHR_DFDSETVAL(bdb, DESCRIPTORBLOCKSIZE, bdbSize);
        KHR_DFDSETVAL(bdb, MODEL, KHR_DF_MODEL_ETC1S);
        KHR_DFDSETVAL(bdb, PRIMARIES, KHR_DF_PRIMARIES_BT709);
        KHR_DFDSETVAL(bdb, TRANSFER, KHR_DF_TRANSFER_SRGB);
        KHR_DFDSETVAL(bdb, FLAGS, 0);

        bdb[KHR_DF_WORD_TEXELBLOCKDIMENSION0] =
                                3 | (3 << KHR_DF_SHIFT_TEXELBLOCKDIMENSION1);
        bdb[KHR_DF_WORD_BYTESPLANE0] = 0; /* bytesPlane3..0 = 0 */
        //KHR_DFDSETVAL(nbdb, BYTESPLANE0, 8);
        //if (sampleCoount == 2)
        //    KHR_DFDSETVAL(nbdb, BYTESPLANE1, 8);
        bdb[KHR_DF_WORD_BYTESPLANE4] = 0; /* bytesPlane7..5 = 0 */

        for (uint32_t sample = 0; sample < sampleCount; sample++) {
            uint16_t channelId, bitOffset;
            if (sample == 0) {
                bitOffset = 0;
                channelId = KHR_DF_CHANNEL_ETC1S_RGB;
            } else {
                bitOffset = 64;
                channelId = KHR_DF_CHANNEL_ETC1S_AAA;
            }
            KHR_DFDSETSVAL(bdb, sample, CHANNELID, channelId);
            KHR_DFDSETSVAL(bdb, sample, QUALIFIERS, 0);
            KHR_DFDSETSVAL(bdb, sample, SAMPLEPOSITION_ALL, 0);
            KHR_DFDSETSVAL(bdb, sample, BITOFFSET, bitOffset);
            KHR_DFDSETSVAL(bdb, sample, BITLENGTH, 63);
            KHR_DFDSETSVAL(bdb, sample, SAMPLELOWER, 0);
            KHR_DFDSETSVAL(bdb, sample, SAMPLEUPPER, UINT32_MAX);
        }
        reconstructDFDBytesPlanesFromSamples(dfd);
        EXPECT_EQ(8U, KHR_DFDVAL(bdb, BYTESPLANE0));
        if (sampleCount == 2)
            EXPECT_EQ(8U, KHR_DFDVAL(bdb, BYTESPLANE1));
        else
            EXPECT_EQ(0U, KHR_DFDVAL(bdb, BYTESPLANE1));
        EXPECT_EQ(0U, KHR_DFDVAL(bdb, BYTESPLANE2));
        EXPECT_EQ(0U, KHR_DFDVAL(bdb, BYTESPLANE3));
        EXPECT_EQ(0U, bdb[KHR_DF_WORD_BYTESPLANE4]);

        delete[] dfd;
    }
}